

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

int __thiscall cmsys::CommandLineArguments::Parse(CommandLineArguments *this)

{
  ErrorCallbackType p_Var1;
  Internal *pIVar2;
  size_type sVar3;
  stl_string *psVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  pointer pbVar8;
  size_type sVar9;
  CommandLineArgumentsCallbackStructure *pCVar10;
  reference s;
  mapped_type *pmVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  ostream *poVar15;
  String local_c8;
  string *local_a8;
  string *marg;
  reference local_98;
  string *sarg;
  mapped_type *local_70;
  CommandLineArgumentsCallbackStructure *cs;
  size_type maxlen;
  size_type maxidx;
  size_type kk;
  stl_string *local_40;
  string *arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  size_type cc;
  CommandLineArguments *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arg);
  if ((this->StoreUnusedArgumentsFlag & 1U) != 0) {
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::clear
              (&(this->Internals->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>);
  }
  matches.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    pbVar5 = matches.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar8 = (pointer)std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                 this->Internals);
    if (pbVar8 <= pbVar5) {
      this_local._4_4_ = 1;
LAB_00131456:
      marg._4_4_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arg);
      return this_local._4_4_;
    }
    local_40 = &std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                          ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals,
                           (size_type)
                           matches.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_string;
    this->Internals->LastArgument =
         (size_type)
         matches.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar6 = GetMatchedArguments(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&arg,local_40);
    if (bVar6) {
      maxlen = 0;
      cs = (CommandLineArgumentsCallbackStructure *)0x0;
      for (maxidx = 0; sVar3 = maxidx,
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&arg), sVar3 < sVar9; maxidx = maxidx + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&arg,maxidx);
        pCVar10 = (CommandLineArgumentsCallbackStructure *)std::__cxx11::string::size();
        if (cs < pCVar10) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&arg,maxidx);
          cs = (CommandLineArgumentsCallbackStructure *)std::__cxx11::string::size();
          maxlen = maxidx;
        }
      }
      pIVar2 = this->Internals;
      s = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&arg,maxlen);
      String::String((String *)&sarg,s,0,0xffffffffffffffff);
      pmVar11 = std::
                map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                ::operator[](&(pIVar2->Callbacks).
                              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                             ,(key_type *)&sarg);
      String::~String((String *)&sarg);
      local_70 = pmVar11;
      local_98 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arg,maxlen);
      bVar6 = std::operator!=(local_70->Argument,local_98);
      pbVar5 = matches.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pmVar11 = local_70;
      if (bVar6) {
        abort();
      }
      switch(local_70->ArgumentType) {
      case 0:
        bVar6 = PopulateVariable(this,local_70,(char *)0x0);
        if (!bVar6) {
          this_local._4_4_ = 0;
          goto LAB_00131456;
        }
        break;
      case 1:
        lVar12 = std::__cxx11::string::c_str();
        lVar13 = std::__cxx11::string::size();
        bVar6 = PopulateVariable(this,pmVar11,(char *)(lVar12 + lVar13));
        if (!bVar6) {
          this_local._4_4_ = 0;
          goto LAB_00131456;
        }
        break;
      case 2:
        sVar9 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                          ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals)
        ;
        pmVar11 = local_70;
        if (pbVar5 == (pointer)(sVar9 - 1)) {
          this->Internals->LastArgument = this->Internals->LastArgument - 1;
          this_local._4_4_ = 0;
          goto LAB_00131456;
        }
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                  ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals,
                   (size_type)
                   &(matches.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        bVar6 = PopulateVariable(this,pmVar11,pcVar14);
        if (!bVar6) {
          this_local._4_4_ = 0;
          goto LAB_00131456;
        }
        matches.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)&(matches.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
        break;
      case 3:
        lVar12 = std::__cxx11::string::size();
        lVar13 = std::__cxx11::string::size();
        psVar4 = local_40;
        if (lVar12 != lVar13) {
          std::__cxx11::string::size();
          pcVar14 = (char *)std::__cxx11::string::at((ulong)psVar4);
          pmVar11 = local_70;
          if (*pcVar14 == '=') {
            lVar12 = std::__cxx11::string::c_str();
            lVar13 = std::__cxx11::string::size();
            bVar6 = PopulateVariable(this,pmVar11,(char *)(lVar12 + 1 + lVar13));
            if (bVar6) break;
            this_local._4_4_ = 0;
            goto LAB_00131456;
          }
        }
        this->Internals->LastArgument = this->Internals->LastArgument - 1;
        this_local._4_4_ = 0;
        goto LAB_00131456;
      case 4:
        while( true ) {
          matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)&(matches.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
          pbVar5 = matches.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar8 = (pointer)std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                                      ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                       this->Internals);
          if (pbVar8 <= pbVar5) break;
          local_a8 = &std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                 this->Internals,
                                 (size_type)
                                 matches.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_string;
          bVar6 = GetMatchedArguments(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&arg,local_a8);
          pmVar11 = local_70;
          if (bVar6) break;
          pcVar14 = (char *)std::__cxx11::string::c_str();
          bVar6 = PopulateVariable(this,pmVar11,pcVar14);
          if (!bVar6) {
            this_local._4_4_ = 0;
            goto LAB_00131456;
          }
        }
        pbVar5 = matches.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar8 = (pointer)std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                                    ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                     this->Internals);
        if (pbVar5 != pbVar8) {
          matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&matches.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].field_2 + 0xf
                        );
        }
        break;
      default:
        poVar15 = std::operator<<((ostream *)&std::cerr,"Got unknown argument type: \"");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_70->ArgumentType);
        poVar15 = std::operator<<(poVar15,"\"");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        this->Internals->LastArgument = this->Internals->LastArgument - 1;
        this_local._4_4_ = 0;
        goto LAB_00131456;
      }
    }
    else {
      if (this->Internals->UnknownArgumentCallback != (ErrorCallbackType)0x0) {
        p_Var1 = this->Internals->UnknownArgumentCallback;
        pcVar14 = (char *)std::__cxx11::string::c_str();
        iVar7 = (*p_Var1)(pcVar14,this->Internals->ClientData);
        if (iVar7 == 0) {
          this->Internals->LastArgument = this->Internals->LastArgument - 1;
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
        }
        goto LAB_00131456;
      }
      if ((this->StoreUnusedArgumentsFlag & 1U) == 0) {
        poVar15 = std::operator<<((ostream *)&std::cerr,"Got unknown argument: \"");
        poVar15 = std::operator<<(poVar15,(string *)local_40);
        poVar15 = std::operator<<(poVar15,"\"");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        this->Internals->LastArgument = this->Internals->LastArgument - 1;
        this_local._4_4_ = 0;
        goto LAB_00131456;
      }
      pIVar2 = this->Internals;
      String::String(&local_c8,local_40,0,0xffffffffffffffff);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
                (&(pIVar2->UnusedArguments).
                  super_vector<cmsys::String,_std::allocator<cmsys::String>_>,&local_c8);
      String::~String(&local_c8);
    }
    matches.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&(matches.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
  } while( true );
}

Assistant:

int CommandLineArguments::Parse()
{
  std::vector<std::string>::size_type cc;
  std::vector<std::string> matches;
  if (this->StoreUnusedArgumentsFlag) {
    this->Internals->UnusedArguments.clear();
  }
  for (cc = 0; cc < this->Internals->Argv.size(); cc++) {
    const std::string& arg = this->Internals->Argv[cc];
    CommandLineArguments_DEBUG("Process argument: " << arg);
    this->Internals->LastArgument = cc;
    if (this->GetMatchedArguments(&matches, arg)) {
      // Ok, we found one or more arguments that match what user specified.
      // Let's find the longest one.
      CommandLineArguments::Internal::VectorOfStrings::size_type kk;
      CommandLineArguments::Internal::VectorOfStrings::size_type maxidx = 0;
      CommandLineArguments::Internal::String::size_type maxlen = 0;
      for (kk = 0; kk < matches.size(); kk++) {
        if (matches[kk].size() > maxlen) {
          maxlen = matches[kk].size();
          maxidx = kk;
        }
      }
      // So, the longest one is probably the right one. Now see if it has any
      // additional value
      CommandLineArgumentsCallbackStructure* cs =
        &this->Internals->Callbacks[matches[maxidx]];
      const std::string& sarg = matches[maxidx];
      if (cs->Argument != sarg) {
        abort();
      }
      switch (cs->ArgumentType) {
        case NO_ARGUMENT:
          // No value
          if (!this->PopulateVariable(cs, nullptr)) {
            return 0;
          }
          break;
        case SPACE_ARGUMENT:
          if (cc == this->Internals->Argv.size() - 1) {
            this->Internals->LastArgument--;
            return 0;
          }
          CommandLineArguments_DEBUG("This is a space argument: "
                                     << arg << " value: "
                                     << this->Internals->Argv[cc + 1]);
          // Value is the next argument
          if (!this->PopulateVariable(cs,
                                      this->Internals->Argv[cc + 1].c_str())) {
            return 0;
          }
          cc++;
          break;
        case EQUAL_ARGUMENT:
          if (arg.size() == sarg.size() || arg.at(sarg.size()) != '=') {
            this->Internals->LastArgument--;
            return 0;
          }
          // Value is everythng followed the '=' sign
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size() + 1)) {
            return 0;
          }
          break;
        case CONCAT_ARGUMENT:
          // Value is whatever follows the argument
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size())) {
            return 0;
          }
          break;
        case MULTI_ARGUMENT:
          // Suck in all the rest of the arguments
          CommandLineArguments_DEBUG("This is a multi argument: " << arg);
          for (cc++; cc < this->Internals->Argv.size(); ++cc) {
            const std::string& marg = this->Internals->Argv[cc];
            CommandLineArguments_DEBUG(
              " check multi argument value: " << marg);
            if (this->GetMatchedArguments(&matches, marg)) {
              CommandLineArguments_DEBUG("End of multi argument "
                                         << arg << " with value: " << marg);
              break;
            }
            CommandLineArguments_DEBUG(
              " populate multi argument value: " << marg);
            if (!this->PopulateVariable(cs, marg.c_str())) {
              return 0;
            }
          }
          if (cc != this->Internals->Argv.size()) {
            CommandLineArguments_DEBUG("Again End of multi argument " << arg);
            cc--;
            continue;
          }
          break;
        default:
          std::cerr << "Got unknown argument type: \"" << cs->ArgumentType
                    << "\"" << std::endl;
          this->Internals->LastArgument--;
          return 0;
      }
    } else {
      // Handle unknown arguments
      if (this->Internals->UnknownArgumentCallback) {
        if (!this->Internals->UnknownArgumentCallback(
              arg.c_str(), this->Internals->ClientData)) {
          this->Internals->LastArgument--;
          return 0;
        }
        return 1;
      } else if (this->StoreUnusedArgumentsFlag) {
        CommandLineArguments_DEBUG("Store unused argument " << arg);
        this->Internals->UnusedArguments.push_back(arg);
      } else {
        std::cerr << "Got unknown argument: \"" << arg << "\"" << std::endl;
        this->Internals->LastArgument--;
        return 0;
      }
    }
  }
  return 1;
}